

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O1

type __thiscall obs::signal<int(int)>::operator()(signal<int(int)> *this,int *args)

{
  bool bVar1;
  int iVar2;
  iterator __begin0;
  iterator __end0;
  iterator local_70;
  iterator local_48;
  
  safe_list<obs::slot<int_(int)>_>::begin(&local_70,(safe_list<obs::slot<int_(int)>_> *)(this + 8));
  safe_list<obs::slot<int_(int)>_>::end(&local_48,(safe_list<obs::slot<int_(int)>_> *)(this + 8));
  iVar2 = 0;
  while( true ) {
    bVar1 = safe_list<obs::slot<int_(int)>_>::iterator::operator!=(&local_70,&local_48);
    if (!bVar1) {
      safe_list<obs::slot<int_(int)>_>::iterator::~iterator(&local_48);
      safe_list<obs::slot<int_(int)>_>::iterator::~iterator(&local_70);
      return iVar2;
    }
    if ((local_70.m_node == (node *)0x0) || (local_70.m_locked == false)) break;
    if (local_70.m_value != (slot<int_(int)> *)0x0) {
      iVar2 = slot<int(int)>::operator()((slot<int(int)> *)local_70.m_value,args);
    }
    safe_list<obs::slot<int_(int)>_>::iterator::operator++(&local_70);
  }
  __assert_fail("m_node && m_locked",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0xd8,
                "T *obs::safe_list<obs::slot<int (int)>>::iterator::operator*() const [T = obs::slot<int (int)>]"
               );
}

Assistant:

typename std::enable_if<!std::is_void<R>::value, R>::type
  operator()(Args2&&...args) {
    R result = R();
    for (auto slot : m_slots)
      if (slot)
        result = (*slot)(std::forward<Args2>(args)...);
    return result;
  }